

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_clone.c
# Opt level: O3

void clone_setn(t_clone *x,t_floatarg f)

{
  ulong uVar1;
  uint uVar2;
  t_atom *ptVar3;
  int oldstate;
  uint uVar4;
  int iVar5;
  _glist *p_Var6;
  t_copy *ptVar7;
  t_out **pptVar8;
  t_out *ptVar9;
  long lVar10;
  long lVar11;
  int m;
  ulong uVar12;
  
  oldstate = canvas_suspend_dsp();
  uVar2 = x->x_n;
  uVar4 = (uint)f;
  if ((int)uVar4 < 1) {
    pd_error(x,"can\'t resize to zero or negative number; setting to 1");
    uVar4 = 1;
  }
  if ((int)uVar2 < (int)uVar4) {
    uVar12 = (long)(int)uVar2;
    do {
      ptVar3 = x->x_argv;
      ptVar3->a_type = A_FLOAT;
      m = (int)uVar12;
      (ptVar3->a_w).w_float = (float)(x->x_startvoice + m);
      p_Var6 = clone_makeone(x->x_s,x->x_argc - x->x_suppressvoice,x->x_argv + x->x_suppressvoice);
      if (p_Var6 == (_glist *)0x0) {
        pd_error(x,"clone: couldn\'t create \'%s\'",x->x_s->s_name);
        goto LAB_0013a7b8;
      }
      uVar1 = uVar12 + 1;
      ptVar7 = (t_copy *)resizebytes(x->x_vec,uVar12 * 0x10,uVar1 * 0x10);
      x->x_vec = ptVar7;
      ptVar7[uVar12].c_gl = p_Var6;
      ptVar7[uVar12].c_on = 0;
      pptVar8 = (t_out **)resizebytes(x->x_outvec,uVar12 * 8,uVar12 * 8 + 8);
      x->x_outvec = pptVar8;
      ptVar9 = (t_out *)getbytes((long)x->x_nout * 0x18);
      x->x_outvec[uVar12] = ptVar9;
      if (0 < x->x_nout) {
        lVar11 = 0;
        lVar10 = 0;
        do {
          *(_class **)((long)&ptVar9->o_pd + lVar11) = clone_out_class;
          iVar5 = obj_issignaloutlet(&x->x_vec->c_gl->gl_obj,m);
          *(int *)((long)&ptVar9->o_signal + lVar11) = iVar5;
          *(int *)((long)&ptVar9->o_n + lVar11) = x->x_startvoice + m;
          *(undefined8 *)((long)&ptVar9->o_outlet + lVar11) =
               *(undefined8 *)((long)&(*x->x_outvec)->o_outlet + lVar11);
          obj_connect(&(x->x_vec[uVar12].c_gl)->gl_obj,(int)lVar10,
                      (t_object *)((long)&ptVar9->o_pd + lVar11),0);
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0x18;
        } while (lVar10 < x->x_nout);
      }
      x->x_n = x->x_n + 1;
      uVar12 = uVar1;
    } while (uVar1 != uVar4);
  }
  if ((int)uVar4 < (int)uVar2) {
    uVar12 = (ulong)uVar4;
    lVar10 = uVar12 << 4;
    lVar11 = uVar2 - uVar12;
    do {
      canvas_closebang(*(_glist **)((long)&x->x_vec->c_gl + lVar10));
      pd_free(*(t_pd **)((long)&x->x_vec->c_gl + lVar10));
      lVar10 = lVar10 + 0x10;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    ptVar7 = (t_copy *)resizebytes(x->x_vec,(ulong)uVar2 << 4,uVar12 << 4);
    x->x_vec = ptVar7;
    x->x_n = uVar4;
  }
LAB_0013a7b8:
  canvas_resume_dsp(oldstate);
  return;
}

Assistant:

void clone_setn(t_clone *x, t_floatarg f)
{
    int dspstate = canvas_suspend_dsp();
    int nwas = x->x_n, wantn = f, i, j;
    if (wantn < 1)
    {
        pd_error(x, "can't resize to zero or negative number; setting to 1");
        wantn = 1;
    }
    if (wantn > nwas)
        for (i = nwas; i < wantn; i++)
    {
        t_canvas *c;
        t_out *outvec;
        SETFLOAT(x->x_argv, x->x_startvoice + i);
        if (!(c = clone_makeone(x->x_s, x->x_argc - x->x_suppressvoice,
            x->x_argv + x->x_suppressvoice)))
        {
            pd_error(x, "clone: couldn't create '%s'", x->x_s->s_name);
            goto done;
        }
        x->x_vec = (t_copy *)t_resizebytes(x->x_vec, i * sizeof(t_copy),
            (i+1) * sizeof(t_copy));
        x->x_vec[i].c_gl = c;
        x->x_vec[i].c_on = 0;
        x->x_outvec = (t_out **)t_resizebytes(x->x_outvec,
            i * sizeof(*x->x_outvec), (i+1) * sizeof(*x->x_outvec));
        x->x_outvec[i] = outvec =
            (t_out *)getbytes(x->x_nout * sizeof(*outvec));
        for (j = 0; j < x->x_nout; j++)
        {
            outvec[j].o_pd = clone_out_class;
            outvec[j].o_signal =
                obj_issignaloutlet(&x->x_vec[0].c_gl->gl_obj, i);
            outvec[j].o_n = x->x_startvoice + i;
            outvec[j].o_outlet =
                x->x_outvec[0][j].o_outlet;
            obj_connect(&x->x_vec[i].c_gl->gl_obj, j,
                (t_object *)(&outvec[j]), 0);
        }
        x->x_n++;
    }
    if (wantn < nwas)
    {
        for (i = wantn; i < nwas; i++)
        {
            canvas_closebang(x->x_vec[i].c_gl);
            pd_free(&x->x_vec[i].c_gl->gl_pd);
        }
        x->x_vec = (t_copy *)t_resizebytes(x->x_vec, nwas * sizeof(t_copy),
            wantn * sizeof(*x->x_vec));
        x->x_n = wantn;
    }
done:
    canvas_resume_dsp(dspstate);
}